

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O2

int __thiscall buffer_queue<int>::get_rcnt(buffer_queue<int> *this)

{
  int iVar1;
  
  std::mutex::lock(&this->b_mutex);
  if (this->b_debug == true) {
    iVar1 = (int)this->b_rcnt;
  }
  else {
    iVar1 = -1;
    if (0 < pr_level) {
      printf("[%-5s][%s:%d] this method is invalid when q_debug is false!\n","warn","get_rcnt",0x41)
      ;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return iVar1;
}

Assistant:

int get_rcnt() const
    {
        lock_guard<mutex> lck (b_mutex);
        if(b_debug)
        {
            return b_rcnt;    
        }
        PR_WARN("this method is invalid when q_debug is false!\n");
        return -1;
    }